

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O2

void NALUnit::writeUEGolombCode(BitStreamWriter *bitWriter,uint32_t value)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint num;
  
  iVar3 = 1;
  num = 0;
  for (uVar2 = 0; uVar2 < value; uVar2 = uVar2 + iVar1) {
    num = num + 1;
    iVar1 = iVar3 * 2;
    iVar3 = iVar3 * 2;
  }
  BitStreamWriter::putBits(bitWriter,num + 1,1);
  BitStreamWriter::putBits(bitWriter,num,(value - iVar3) + 1);
  return;
}

Assistant:

void NALUnit::writeUEGolombCode(BitStreamWriter& bitWriter, const uint32_t value)
{
    uint32_t maxVal = 0;
    int x = 1;
    int nBit = 0;
    for (; maxVal < value; maxVal += x)
    {
        x <<= 1;
        nBit++;
    }

    bitWriter.putBits(nBit + 1, 1);
    bitWriter.putBits(nBit, value - (x - 1));
}